

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx::
     BVHNIntersector1<8,_16777232,_false,_embree::avx::ArrayIntersector1<embree::avx::InstanceIntersector1MB>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float fVar3;
  undefined4 uVar4;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  bool bVar14;
  AABBNodeMB4D *node1;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  NodeRef *pNVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  size_t sVar23;
  InstancePrimitive *prim;
  int iVar24;
  ulong unaff_R14;
  size_t mask;
  bool bVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [64];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [64];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [64];
  float fVar38;
  undefined1 auVar39 [32];
  float fVar41;
  float fVar42;
  float fVar43;
  undefined1 auVar40 [64];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  undefined1 auVar56 [32];
  Precalculations pre;
  NodeRef stack [564];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    fVar3 = ray->tfar;
    auVar32 = ZEXT1664(ZEXT816(0) << 0x40);
    if (0.0 <= fVar3) {
      pNVar19 = stack + 1;
      stack[0].ptr = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
      aVar5 = (ray->dir).field_0;
      auVar6 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar26._8_4_ = 0x7fffffff;
      auVar26._0_8_ = 0x7fffffff7fffffff;
      auVar26._12_4_ = 0x7fffffff;
      auVar26 = vandps_avx((undefined1  [16])aVar5,auVar26);
      auVar44._8_4_ = 0x219392ef;
      auVar44._0_8_ = 0x219392ef219392ef;
      auVar44._12_4_ = 0x219392ef;
      auVar26 = vcmpps_avx(auVar26,auVar44,1);
      auVar26 = vblendvps_avx((undefined1  [16])aVar5,auVar44,auVar26);
      auVar44 = vrcpps_avx(auVar26);
      fVar38 = auVar44._0_4_;
      auVar33._0_4_ = fVar38 * auVar26._0_4_;
      fVar41 = auVar44._4_4_;
      auVar33._4_4_ = fVar41 * auVar26._4_4_;
      fVar42 = auVar44._8_4_;
      auVar33._8_4_ = fVar42 * auVar26._8_4_;
      fVar43 = auVar44._12_4_;
      auVar33._12_4_ = fVar43 * auVar26._12_4_;
      auVar45._8_4_ = 0x3f800000;
      auVar45._0_8_ = &DAT_3f8000003f800000;
      auVar45._12_4_ = 0x3f800000;
      auVar26 = vsubps_avx(auVar45,auVar33);
      auVar34._0_4_ = fVar38 + fVar38 * auVar26._0_4_;
      auVar34._4_4_ = fVar41 + fVar41 * auVar26._4_4_;
      auVar34._8_4_ = fVar42 + fVar42 * auVar26._8_4_;
      auVar34._12_4_ = fVar43 + fVar43 * auVar26._12_4_;
      uVar4 = *(undefined4 *)&(ray->org).field_0;
      auVar47._4_4_ = uVar4;
      auVar47._0_4_ = uVar4;
      auVar47._8_4_ = uVar4;
      auVar47._12_4_ = uVar4;
      auVar47._16_4_ = uVar4;
      auVar47._20_4_ = uVar4;
      auVar47._24_4_ = uVar4;
      auVar47._28_4_ = uVar4;
      uVar4 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
      auVar48._4_4_ = uVar4;
      auVar48._0_4_ = uVar4;
      auVar48._8_4_ = uVar4;
      auVar48._12_4_ = uVar4;
      auVar48._16_4_ = uVar4;
      auVar48._20_4_ = uVar4;
      auVar48._24_4_ = uVar4;
      auVar48._28_4_ = uVar4;
      uVar4 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
      auVar49._4_4_ = uVar4;
      auVar49._0_4_ = uVar4;
      auVar49._8_4_ = uVar4;
      auVar49._12_4_ = uVar4;
      auVar49._16_4_ = uVar4;
      auVar49._20_4_ = uVar4;
      auVar49._24_4_ = uVar4;
      auVar49._28_4_ = uVar4;
      auVar33 = vshufps_avx(auVar34,auVar34,0);
      auVar26 = vmovshdup_avx(auVar34);
      auVar40 = ZEXT1664(auVar26);
      auVar45 = vshufps_avx(auVar34,auVar34,0x55);
      auVar44 = vshufpd_avx(auVar34,auVar34,1);
      auVar7 = vshufps_avx(auVar34,auVar34,0xaa);
      auVar37 = ZEXT1664(auVar7);
      uVar20 = (ulong)(auVar34._0_4_ < 0.0) * 0x20;
      uVar21 = (ulong)(auVar26._0_4_ < 0.0) << 5 | 0x40;
      uVar22 = (ulong)(auVar44._0_4_ < 0.0) << 5 | 0x80;
      auVar26 = vshufps_avx(auVar6,auVar6,0);
      auVar29 = ZEXT1664(auVar26);
      auVar46._16_16_ = auVar26;
      auVar46._0_16_ = auVar26;
      auVar26 = vshufps_avx(ZEXT416((uint)fVar3),ZEXT416((uint)fVar3),0);
      auVar56._16_16_ = auVar26;
      auVar56._0_16_ = auVar26;
      do {
        if (pNVar19 == stack) {
          return;
        }
        sVar23 = pNVar19[-1].ptr;
        pNVar19 = pNVar19 + -1;
        do {
          if ((sVar23 & 8) == 0) {
            uVar15 = sVar23 & 0xfffffffffffffff0;
            fVar3 = (ray->dir).field_0.m128[3];
            auVar27._4_4_ = fVar3;
            auVar27._0_4_ = fVar3;
            auVar27._8_4_ = fVar3;
            auVar27._12_4_ = fVar3;
            auVar27._16_4_ = fVar3;
            auVar27._20_4_ = fVar3;
            auVar27._24_4_ = fVar3;
            auVar27._28_4_ = fVar3;
            pfVar2 = (float *)(uVar15 + 0x100 + uVar20);
            pfVar1 = (float *)(uVar15 + 0x40 + uVar20);
            auVar28._0_4_ = fVar3 * *pfVar2 + *pfVar1;
            auVar28._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
            auVar28._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
            auVar28._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
            auVar28._16_4_ = fVar3 * pfVar2[4] + pfVar1[4];
            auVar28._20_4_ = fVar3 * pfVar2[5] + pfVar1[5];
            auVar28._24_4_ = fVar3 * pfVar2[6] + pfVar1[6];
            auVar28._28_4_ = auVar29._28_4_ + pfVar1[7];
            auVar28 = vsubps_avx(auVar28,auVar47);
            fVar41 = auVar33._0_4_;
            fVar42 = auVar33._4_4_;
            auVar8._4_4_ = fVar42 * auVar28._4_4_;
            auVar8._0_4_ = fVar41 * auVar28._0_4_;
            fVar43 = auVar33._8_4_;
            auVar8._8_4_ = fVar43 * auVar28._8_4_;
            auVar8._12_4_ = auVar33._12_4_ * auVar28._12_4_;
            auVar8._16_4_ = fVar41 * auVar28._16_4_;
            auVar8._20_4_ = fVar42 * auVar28._20_4_;
            auVar8._24_4_ = fVar43 * auVar28._24_4_;
            auVar8._28_4_ = auVar28._28_4_;
            pfVar2 = (float *)(uVar15 + 0x100 + uVar21);
            pfVar1 = (float *)(uVar15 + 0x40 + uVar21);
            auVar30._0_4_ = fVar3 * *pfVar2 + *pfVar1;
            auVar30._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
            auVar30._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
            auVar30._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
            auVar30._16_4_ = fVar3 * pfVar2[4] + pfVar1[4];
            auVar30._20_4_ = fVar3 * pfVar2[5] + pfVar1[5];
            auVar30._24_4_ = fVar3 * pfVar2[6] + pfVar1[6];
            auVar30._28_4_ = auVar32._28_4_ + pfVar1[7];
            auVar28 = vmaxps_avx(auVar46,auVar8);
            auVar8 = vsubps_avx(auVar30,auVar48);
            pfVar2 = (float *)(uVar15 + 0x100 + uVar22);
            fVar50 = auVar45._0_4_;
            fVar51 = auVar45._4_4_;
            auVar9._4_4_ = fVar51 * auVar8._4_4_;
            auVar9._0_4_ = fVar50 * auVar8._0_4_;
            fVar52 = auVar45._8_4_;
            auVar9._8_4_ = fVar52 * auVar8._8_4_;
            auVar9._12_4_ = auVar45._12_4_ * auVar8._12_4_;
            auVar9._16_4_ = fVar50 * auVar8._16_4_;
            auVar9._20_4_ = fVar51 * auVar8._20_4_;
            auVar9._24_4_ = fVar52 * auVar8._24_4_;
            auVar9._28_4_ = auVar8._28_4_;
            pfVar1 = (float *)(uVar15 + 0x40 + uVar22);
            auVar35._0_4_ = fVar3 * *pfVar2 + *pfVar1;
            auVar35._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
            auVar35._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
            auVar35._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
            auVar35._16_4_ = fVar3 * pfVar2[4] + pfVar1[4];
            auVar35._20_4_ = fVar3 * pfVar2[5] + pfVar1[5];
            auVar35._24_4_ = fVar3 * pfVar2[6] + pfVar1[6];
            auVar35._28_4_ = auVar37._28_4_ + pfVar1[7];
            auVar8 = vsubps_avx(auVar35,auVar49);
            fVar53 = auVar7._0_4_;
            fVar54 = auVar7._4_4_;
            auVar10._4_4_ = fVar54 * auVar8._4_4_;
            auVar10._0_4_ = fVar53 * auVar8._0_4_;
            fVar55 = auVar7._8_4_;
            auVar10._8_4_ = fVar55 * auVar8._8_4_;
            auVar10._12_4_ = auVar7._12_4_ * auVar8._12_4_;
            auVar10._16_4_ = fVar53 * auVar8._16_4_;
            auVar10._20_4_ = fVar54 * auVar8._20_4_;
            fVar38 = auVar8._28_4_;
            auVar10._24_4_ = fVar55 * auVar8._24_4_;
            auVar10._28_4_ = fVar38;
            auVar8 = vmaxps_avx(auVar9,auVar10);
            pfVar2 = (float *)(uVar15 + 0x100 + (uVar20 ^ 0x20));
            auVar28 = vmaxps_avx(auVar28,auVar8);
            pfVar1 = (float *)(uVar15 + 0x40 + (uVar20 ^ 0x20));
            auVar31._0_4_ = fVar3 * *pfVar2 + *pfVar1;
            auVar31._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
            auVar31._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
            auVar31._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
            auVar31._16_4_ = fVar3 * pfVar2[4] + pfVar1[4];
            auVar31._20_4_ = fVar3 * pfVar2[5] + pfVar1[5];
            auVar31._24_4_ = fVar3 * pfVar2[6] + pfVar1[6];
            auVar31._28_4_ = fVar38 + pfVar1[7];
            auVar8 = vsubps_avx(auVar31,auVar47);
            auVar11._4_4_ = fVar42 * auVar8._4_4_;
            auVar11._0_4_ = fVar41 * auVar8._0_4_;
            auVar11._8_4_ = fVar43 * auVar8._8_4_;
            auVar11._12_4_ = auVar33._12_4_ * auVar8._12_4_;
            auVar11._16_4_ = fVar41 * auVar8._16_4_;
            auVar11._20_4_ = fVar42 * auVar8._20_4_;
            auVar11._24_4_ = fVar43 * auVar8._24_4_;
            auVar11._28_4_ = auVar8._28_4_;
            auVar8 = vminps_avx(auVar56,auVar11);
            pfVar2 = (float *)(uVar15 + 0x100 + (uVar21 ^ 0x20));
            pfVar1 = (float *)(uVar15 + 0x40 + (uVar21 ^ 0x20));
            auVar36._0_4_ = fVar3 * *pfVar2 + *pfVar1;
            auVar36._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
            auVar36._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
            auVar36._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
            auVar36._16_4_ = fVar3 * pfVar2[4] + pfVar1[4];
            auVar36._20_4_ = fVar3 * pfVar2[5] + pfVar1[5];
            auVar36._24_4_ = fVar3 * pfVar2[6] + pfVar1[6];
            auVar36._28_4_ = fVar38 + pfVar1[7];
            auVar9 = vsubps_avx(auVar36,auVar48);
            auVar12._4_4_ = fVar51 * auVar9._4_4_;
            auVar12._0_4_ = fVar50 * auVar9._0_4_;
            auVar12._8_4_ = fVar52 * auVar9._8_4_;
            auVar12._12_4_ = auVar45._12_4_ * auVar9._12_4_;
            auVar12._16_4_ = fVar50 * auVar9._16_4_;
            auVar12._20_4_ = fVar51 * auVar9._20_4_;
            auVar12._24_4_ = fVar52 * auVar9._24_4_;
            auVar12._28_4_ = auVar9._28_4_;
            pfVar2 = (float *)(uVar15 + 0x100 + (uVar22 ^ 0x20));
            pfVar1 = (float *)(uVar15 + 0x40 + (uVar22 ^ 0x20));
            auVar39._0_4_ = fVar3 * *pfVar2 + *pfVar1;
            auVar39._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
            auVar39._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
            auVar39._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
            auVar39._16_4_ = fVar3 * pfVar2[4] + pfVar1[4];
            auVar39._20_4_ = fVar3 * pfVar2[5] + pfVar1[5];
            auVar39._24_4_ = fVar3 * pfVar2[6] + pfVar1[6];
            auVar39._28_4_ = auVar40._28_4_ + pfVar1[7];
            auVar9 = vsubps_avx(auVar39,auVar49);
            auVar13._4_4_ = fVar54 * auVar9._4_4_;
            auVar13._0_4_ = fVar53 * auVar9._0_4_;
            auVar13._8_4_ = fVar55 * auVar9._8_4_;
            auVar13._12_4_ = auVar7._12_4_ * auVar9._12_4_;
            auVar13._16_4_ = fVar53 * auVar9._16_4_;
            auVar13._20_4_ = fVar54 * auVar9._20_4_;
            auVar13._24_4_ = fVar55 * auVar9._24_4_;
            auVar13._28_4_ = auVar9._28_4_;
            auVar40 = ZEXT3264(auVar13);
            auVar9 = vminps_avx(auVar12,auVar13);
            auVar37 = ZEXT3264(auVar9);
            auVar8 = vminps_avx(auVar8,auVar9);
            auVar28 = vcmpps_avx(auVar28,auVar8,2);
            auVar29 = ZEXT3264(auVar28);
            if (((uint)sVar23 & 7) == 6) {
              auVar8 = vcmpps_avx(*(undefined1 (*) [32])(uVar15 + 0x1c0),auVar27,2);
              auVar9 = vcmpps_avx(auVar27,*(undefined1 (*) [32])(uVar15 + 0x1e0),1);
              auVar9 = vandps_avx(auVar8,auVar9);
              auVar28 = vandps_avx(auVar9,auVar28);
              auVar29 = ZEXT1664(auVar28._16_16_);
              auVar26 = vpackssdw_avx(auVar28._0_16_,auVar28._16_16_);
            }
            else {
              auVar26 = vpackssdw_avx(auVar28._0_16_,auVar28._16_16_);
            }
            auVar32 = ZEXT3264(auVar8);
            auVar26 = vpsllw_avx(auVar26,0xf);
            auVar26 = vpacksswb_avx(auVar26,auVar26);
            unaff_R14 = (ulong)(byte)(SUB161(auVar26 >> 7,0) & 1 |
                                      (SUB161(auVar26 >> 0xf,0) & 1) << 1 |
                                      (SUB161(auVar26 >> 0x17,0) & 1) << 2 |
                                      (SUB161(auVar26 >> 0x1f,0) & 1) << 3 |
                                      (SUB161(auVar26 >> 0x27,0) & 1) << 4 |
                                      (SUB161(auVar26 >> 0x2f,0) & 1) << 5 |
                                      (SUB161(auVar26 >> 0x37,0) & 1) << 6 |
                                     SUB161(auVar26 >> 0x3f,0) << 7);
          }
          if ((sVar23 & 8) == 0) {
            if (unaff_R14 == 0) {
              iVar24 = 4;
            }
            else {
              uVar15 = sVar23 & 0xfffffffffffffff0;
              lVar17 = 0;
              if (unaff_R14 != 0) {
                for (; (unaff_R14 >> lVar17 & 1) == 0; lVar17 = lVar17 + 1) {
                }
              }
              iVar24 = 0;
              sVar23 = *(size_t *)(uVar15 + lVar17 * 8);
              uVar18 = unaff_R14 - 1 & unaff_R14;
              if (uVar18 != 0) {
                pNVar19->ptr = sVar23;
                lVar17 = 0;
                if (uVar18 != 0) {
                  for (; (uVar18 >> lVar17 & 1) == 0; lVar17 = lVar17 + 1) {
                  }
                }
                uVar16 = uVar18 - 1;
                while( true ) {
                  pNVar19 = pNVar19 + 1;
                  sVar23 = *(size_t *)(uVar15 + lVar17 * 8);
                  uVar16 = uVar16 & uVar18;
                  if (uVar16 == 0) break;
                  pNVar19->ptr = sVar23;
                  lVar17 = 0;
                  if (uVar16 != 0) {
                    for (; (uVar16 >> lVar17 & 1) == 0; lVar17 = lVar17 + 1) {
                    }
                  }
                  uVar18 = uVar16 - 1;
                }
              }
            }
          }
          else {
            iVar24 = 6;
          }
        } while (iVar24 == 0);
        if (iVar24 == 6) {
          uVar15 = (ulong)((uint)sVar23 & 0xf);
          iVar24 = 0;
          bVar25 = uVar15 != 8;
          if (bVar25) {
            prim = (InstancePrimitive *)(sVar23 & 0xfffffffffffffff0);
            auVar29 = ZEXT1664(auVar29._0_16_);
            auVar32 = ZEXT1664(auVar32._0_16_);
            auVar37 = ZEXT1664(auVar37._0_16_);
            auVar40 = ZEXT1664(auVar40._0_16_);
            bVar14 = InstanceIntersector1MB::occluded(&pre,ray,context,prim);
            if (!bVar14) {
              uVar18 = 0;
              do {
                prim = prim + 1;
                if (uVar15 - 9 == uVar18) goto LAB_00312d41;
                bVar25 = InstanceIntersector1MB::occluded(&pre,ray,context,prim);
                uVar18 = uVar18 + 1;
              } while (!bVar25);
              bVar25 = uVar18 < uVar15 - 8;
            }
            iVar24 = 0;
            if (bVar25) {
              ray->tfar = -INFINITY;
              iVar24 = 3;
            }
          }
        }
LAB_00312d41:
      } while (iVar24 != 3);
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }